

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit)

{
  roaring_bitmap_t *prVar1;
  undefined1 uVar2;
  long lVar3;
  container_t *pcVar4;
  
  newit->in_container_index = 0;
  newit->run_index = 0;
  newit->current_value = 0;
  lVar3 = (long)newit->container_index;
  if ((lVar3 < 0) ||
     (prVar1 = newit->parent, (prVar1->high_low_container).size <= newit->container_index)) {
    newit->current_value = 0xffffffff;
    newit->has_value = false;
    uVar2 = 0;
  }
  else {
    newit->has_value = true;
    pcVar4 = (prVar1->high_low_container).containers[lVar3];
    newit->container = pcVar4;
    newit->typecode = (prVar1->high_low_container).typecodes[lVar3];
    newit->highbits = (uint)(prVar1->high_low_container).keys[lVar3] << 0x10;
    pcVar4 = container_unwrap_shared(pcVar4,&newit->typecode);
    newit->container = pcVar4;
    uVar2 = newit->has_value;
  }
  return (_Bool)uVar2;
}

Assistant:

static bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit) {
    newit->in_container_index = 0;
    newit->run_index = 0;
    newit->current_value = 0;
    if (newit->container_index >= newit->parent->high_low_container.size ||
        newit->container_index < 0) {
        newit->current_value = UINT32_MAX;
        return (newit->has_value = false);
    }
    // assume not empty
    newit->has_value = true;
    // we precompute container, typecode and highbits so that successive
    // iterators do not have to grab them from odd memory locations
    // and have to worry about the (easily predicted) container_unwrap_shared
    // call.
    newit->container =
            newit->parent->high_low_container.containers[newit->container_index];
    newit->typecode =
            newit->parent->high_low_container.typecodes[newit->container_index];
    newit->highbits =
            ((uint32_t)
                    newit->parent->high_low_container.keys[newit->container_index])
                    << 16;
    newit->container =
            container_unwrap_shared(newit->container, &(newit->typecode));
    return newit->has_value;
}